

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

string * anon_unknown.dwarf_28c33::skipUntilRegex
                   (string *__return_storage_ptr__,ifstream *fileStream,regex *regExp)

{
  bool bVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)fileStream,(string *)__return_storage_ptr__);
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (__return_storage_ptr__,regExp,0);
  } while (!bVar1);
  return __return_storage_ptr__;
}

Assistant:

string skipUntilRegex(ifstream & fileStream, const regex & regExp) {
        string curString;
        do {
            getline(fileStream, curString);
        } while ( ! regex_search(curString, regExp));
        return curString;
    }